

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<std::complex<float>_>::EqnBackward
          (TPZEqnArray<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *U,
          DecomposeType dec)

{
  int iVar1;
  int *piVar2;
  int in_EDX;
  TPZFMatrix<std::complex<float>_> *in_RSI;
  TPZEqnArray<std::complex<float>_> *in_RDI;
  int i_1;
  complex<float> acum_1;
  int last_term_1;
  int index_1;
  int i;
  complex<float> acum;
  int last_term;
  int index;
  int n;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff58;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff68;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff70;
  complex<float> *in_stack_ffffffffffffff78;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffff80;
  int local_48;
  complex<float> local_44;
  int local_3c;
  int local_38;
  int local_2c;
  complex<float> local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  TPZFMatrix<std::complex<float>_> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  iVar1 = IsSymmetric(in_RDI);
  if (iVar1 == 1) {
    local_18 = in_RDI->fNumEq;
    while (local_18 = local_18 + -1, -1 < local_18) {
      piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
      local_1c = *piVar2;
      piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
      local_20 = *piVar2;
      std::complex<float>::complex(&local_28,0.0,0.0);
      local_2c = local_1c;
      while (local_2c = local_2c + 1, local_2c < local_20) {
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_2c);
        TPZFMatrix<std::complex<float>_>::operator()
                  (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                   (int64_t)in_stack_ffffffffffffff70);
        TPZVec<std::complex<float>_>::operator[]
                  ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_2c);
        std::operator*((complex<float> *)in_stack_ffffffffffffff58,(complex<float> *)0x1d6ae3a);
        std::complex<float>::operator-=
                  ((complex<float> *)in_stack_ffffffffffffff70,
                   (complex<float> *)in_stack_ffffffffffffff68);
      }
      TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
      TPZFMatrix<std::complex<float>_>::operator()
                (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                 (int64_t)in_stack_ffffffffffffff70);
      std::complex<float>::operator+=
                ((complex<float> *)in_stack_ffffffffffffff70,
                 (complex<float> *)in_stack_ffffffffffffff68);
      if (local_14 == 3) {
        TPZVec<std::complex<float>_>::operator[]
                  ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_1c);
        in_stack_ffffffffffffff80 = local_10;
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_1c);
        TPZFMatrix<std::complex<float>_>::operator()
                  (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                   (int64_t)in_stack_ffffffffffffff70);
        std::complex<float>::operator/=
                  ((complex<float> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
    }
  }
  else {
    iVar1 = IsSymmetric(in_RDI);
    if (iVar1 == 2) {
      local_18 = in_RDI->fNumEq;
      while (local_18 = local_18 + -2, -1 < local_18) {
        piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
        local_38 = *piVar2;
        piVar2 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(local_18 + 1));
        local_3c = *piVar2;
        std::complex<float>::complex(&local_44,0.0,0.0);
        local_48 = local_38;
        while (local_48 = local_48 + 1, local_48 < local_3c) {
          in_stack_ffffffffffffff70 = local_10;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_48);
          in_stack_ffffffffffffff78 =
               TPZFMatrix<std::complex<float>_>::operator()
                         (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                          (int64_t)in_stack_ffffffffffffff70);
          TPZVec<std::complex<float>_>::operator[]
                    ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_48);
          std::operator*((complex<float> *)in_stack_ffffffffffffff58,(complex<float> *)0x1d6b027);
          std::complex<float>::operator-=
                    ((complex<float> *)in_stack_ffffffffffffff70,
                     (complex<float> *)in_stack_ffffffffffffff68);
        }
        in_stack_ffffffffffffff68 = local_10;
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_38);
        TPZFMatrix<std::complex<float>_>::operator()
                  (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                   (int64_t)in_stack_ffffffffffffff70);
        std::complex<float>::operator+=
                  ((complex<float> *)in_stack_ffffffffffffff70,
                   (complex<float> *)in_stack_ffffffffffffff68);
        if ((local_14 == 3) || (local_14 == 1)) {
          TPZVec<std::complex<float>_>::operator[]
                    ((TPZVec<std::complex<float>_> *)&in_RDI->fEqValues,(long)local_38);
          in_stack_ffffffffffffff58 = local_10;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_38);
          TPZFMatrix<std::complex<float>_>::operator()
                    (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                     (int64_t)in_stack_ffffffffffffff70);
          std::complex<float>::operator/=
                    ((complex<float> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}